

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

void QIntC::range_check_error<signed_char>(char *cur,char *delta)

{
  char cVar1;
  ostream *poVar2;
  range_error *prVar3;
  string local_370 [32];
  locale local_350 [8];
  ostringstream local_348 [8];
  ostringstream msg_1;
  string local_1c8 [48];
  locale local_198 [8];
  ostringstream local_190 [8];
  ostringstream msg;
  char *delta_local;
  char *cur_local;
  
  if ('\0' < *delta) {
    cVar1 = std::numeric_limits<signed_char>::max();
    if ((int)cVar1 - (int)*cur < (int)*delta) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::locale::classic();
      std::ios::imbue(local_198);
      std::locale::~locale(local_198);
      poVar2 = std::operator<<((ostream *)local_190,"adding ");
      poVar2 = std::operator<<(poVar2,(int)*delta);
      poVar2 = std::operator<<(poVar2," to ");
      poVar2 = std::operator<<(poVar2,(int)*cur);
      std::operator<<(poVar2," would cause an integer overflow");
      prVar3 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::range_error::range_error(prVar3,local_1c8);
      __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
    }
  }
  if (*delta < '\0') {
    cVar1 = std::numeric_limits<signed_char>::min();
    if ((int)*delta < (int)cVar1 - (int)*cur) {
      std::__cxx11::ostringstream::ostringstream(local_348);
      std::locale::classic();
      std::ios::imbue(local_350);
      std::locale::~locale(local_350);
      poVar2 = std::operator<<((ostream *)local_348,"adding ");
      poVar2 = std::operator<<(poVar2,(int)*delta);
      poVar2 = std::operator<<(poVar2," to ");
      poVar2 = std::operator<<(poVar2,(int)*cur);
      std::operator<<(poVar2," would cause an integer underflow");
      prVar3 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::range_error::range_error(prVar3,local_370);
      __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
    }
  }
  return;
}

Assistant:

void
    range_check_error(T const& cur, T const& delta)
    {
        if ((delta > 0) && ((std::numeric_limits<T>::max() - cur) < delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer overflow";
            throw std::range_error(msg.str());
        } else if ((delta < 0) && ((std::numeric_limits<T>::min() - cur) > delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer underflow";
            throw std::range_error(msg.str());
        }
    }